

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapPerm.c
# Opt level: O3

Vec_Int_t *
Amap_LibDeriveGatePerm_rec(Amap_Lib_t *pLib,Kit_DsdNtk_t *pNtk,int iLit,Amap_Nod_t *pNod)

{
  undefined1 *puVar1;
  ushort uVar2;
  ushort uVar3;
  Kit_DsdObj_t *pKVar4;
  Kit_DsdObj_t *pKVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Vec_Int_t *pVVar8;
  Vec_Int_t *p;
  ulong uVar9;
  Vec_Int_t *__ptr;
  uint uVar10;
  uint uVar11;
  Amap_Nod_t *pNod_00;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  Vec_Int_t *local_40;
  int *local_38;
  
  if (-1 < iLit) {
    uVar10 = (uint)iLit >> 1;
    uVar2 = pNtk->nVars;
    if ((uint)pNtk->nNodes + (uint)uVar2 <= uVar10) {
LAB_008bd517:
      __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kit.h"
                    ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
    }
    if ((uVar10 < uVar2) ||
       (pKVar4 = pNtk->pNodes[(ulong)uVar10 - (ulong)uVar2], pKVar4 == (Kit_DsdObj_t *)0x0)) {
      pVVar6 = (Vec_Int_t *)malloc(0x10);
      pVVar6->nCap = 0x10;
      pVVar6->nSize = 0;
      piVar7 = (int *)malloc(0x40);
      pVVar6->pArray = piVar7;
      Vec_IntPush(pVVar6,iLit);
      return pVVar6;
    }
    if (((uint)*pKVar4 & 0x1c0) == 0x140) {
      if (pNod->field_0x3 != '\x06') {
        return (Vec_Int_t *)0x0;
      }
      pVVar6 = (Vec_Int_t *)malloc(0x10);
      pVVar6->nCap = 0x10;
      pVVar6->nSize = 0;
      piVar7 = (int *)malloc(0x40);
      pVVar6->pArray = piVar7;
      if (pNod->iFan0 < 0) goto LAB_008bd536;
      pVVar8 = Amap_LibDeriveGatePerm_rec
                         (pLib,pNtk,(uint)*(ushort *)(pKVar4 + 1),
                          (Amap_Nod_t *)
                          (&pLib->pNodes->field_0x0 + (uint)((ushort)pNod->iFan0 >> 1) * 0x18));
      if (pVVar8 != (Vec_Int_t *)0x0) {
        if (0 < pVVar8->nSize) {
          lVar12 = 0;
          do {
            Vec_IntPush(pVVar6,pVVar8->pArray[lVar12]);
            lVar12 = lVar12 + 1;
          } while (lVar12 < pVVar8->nSize);
        }
        if (pVVar8->pArray != (int *)0x0) {
          free(pVVar8->pArray);
        }
        free(pVVar8);
        if (pNod->iFan1 < 0) goto LAB_008bd536;
        pVVar8 = Amap_LibDeriveGatePerm_rec
                           (pLib,pNtk,(uint)*(ushort *)&pKVar4[1].field_0x2,
                            (Amap_Nod_t *)
                            (&pLib->pNodes->field_0x0 + (uint)((ushort)pNod->iFan1 >> 1) * 0x18));
        if (pVVar8 != (Vec_Int_t *)0x0) {
          if (0 < pVVar8->nSize) {
            lVar12 = 0;
            do {
              Vec_IntPush(pVVar6,pVVar8->pArray[lVar12]);
              lVar12 = lVar12 + 1;
            } while (lVar12 < pVVar8->nSize);
          }
          if (pVVar8->pArray != (int *)0x0) {
            free(pVVar8->pArray);
          }
          free(pVVar8);
          if (pNod->iFan2 < 0) goto LAB_008bd536;
          pVVar8 = Amap_LibDeriveGatePerm_rec
                             (pLib,pNtk,(uint)*(ushort *)(pKVar4 + 2),
                              (Amap_Nod_t *)
                              (&pLib->pNodes->field_0x0 + (uint)((ushort)pNod->iFan2 >> 1) * 0x18));
          if (pVVar8 != (Vec_Int_t *)0x0) {
            if (0 < pVVar8->nSize) {
              lVar12 = 0;
              do {
                Vec_IntPush(pVVar6,pVVar8->pArray[lVar12]);
                lVar12 = lVar12 + 1;
              } while (lVar12 < pVVar8->nSize);
            }
            if (pVVar8->pArray != (int *)0x0) {
              free(pVVar8->pArray);
            }
            free(pVVar8);
            return pVVar6;
          }
        }
      }
    }
    else {
      if (pNod->field_0x3 == '\x06') {
        return (Vec_Int_t *)0x0;
      }
      pVVar6 = Amap_LibCollectFanins(pLib,pNod);
      uVar10 = pVVar6->nSize;
      if (uVar10 == (uint)*pKVar4 >> 0x1a) {
        pVVar8 = (Vec_Int_t *)malloc(0x10);
        pVVar8->nCap = 0x10;
        pVVar8->nSize = 0;
        piVar7 = (int *)malloc(0x40);
        pVVar8->pArray = piVar7;
        local_40 = pVVar8;
        p = (Vec_Int_t *)malloc(0x10);
        p->nCap = 0x10;
        p->nSize = 0;
        piVar7 = (int *)malloc(0x40);
        p->pArray = piVar7;
        if (0x3ffffff < (uint)*pKVar4) {
          uVar14 = (ulong)((uint)*pKVar4 >> 0x1a) + 1;
          do {
            uVar2 = *(ushort *)((long)&pKVar4->field_0x0 + uVar14 * 2);
            uVar11 = (uint)(uVar2 >> 1);
            uVar3 = pNtk->nVars;
            if ((uint)pNtk->nNodes + (uint)uVar3 <= uVar11) goto LAB_008bd517;
            if ((uVar11 < uVar3) ||
               (pNtk->pNodes[(ulong)uVar11 - (ulong)uVar3] == (Kit_DsdObj_t *)0x0)) {
              Vec_IntPush(p,(uint)uVar2);
            }
            else {
              puVar1 = &pNtk->pNodes[(ulong)uVar11 - (ulong)uVar3]->field_0x1;
              *puVar1 = *puVar1 & 0xfd;
            }
            uVar14 = uVar14 - 1;
          } while (1 < uVar14);
        }
        if ((int)uVar10 < 1) {
          uVar11 = 0;
        }
        else {
          piVar7 = pVVar6->pArray;
          uVar14 = 0;
          uVar11 = 0;
          do {
            uVar13 = piVar7[uVar14];
            if (uVar13 == 0) {
              if (p->nSize <= (int)uVar11) {
                Vec_IntFree(pVVar8);
                Vec_IntFree(p);
LAB_008bd4f5:
                Vec_IntFree(pVVar6);
                return (Vec_Int_t *)0x0;
              }
              if ((int)uVar11 < 0) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              uVar9 = (ulong)uVar11;
              uVar11 = uVar11 + 1;
              Vec_IntPush(pVVar8,p->pArray[uVar9]);
            }
            else {
              if ((int)uVar13 < 0) goto LAB_008bd536;
              if (0x3ffffff < (uint)*pKVar4) {
                pNod_00 = pLib->pNodes + (uVar13 >> 1);
                uVar2 = pNtk->nVars;
                uVar9 = (ulong)((uint)*pKVar4 >> 0x1a) + 1;
LAB_008bd300:
                uVar3 = *(ushort *)((long)&pKVar4->field_0x0 + uVar9 * 2);
                uVar13 = (uint)(uVar3 >> 1);
                if (uVar13 < (uint)pNtk->nNodes + (uint)uVar2) {
                  if (((uVar13 < uVar2) ||
                      (pKVar5 = pNtk->pNodes[(ulong)uVar13 - (ulong)uVar2],
                      pKVar5 == (Kit_DsdObj_t *)0x0)) || (((uint)*pKVar5 >> 9 & 1) != 0))
                  goto LAB_008bd393;
                  uVar13 = (uint)*pKVar5 & 0x1c0;
                  if (uVar13 == 0x140) {
                    if (pNod_00->field_0x3 == '\x06') goto LAB_008bd3e6;
                    goto LAB_008bd393;
                  }
                  if (uVar13 == 0x100) {
                    if (pNod_00->field_0x3 != '\x05') goto LAB_008bd393;
                  }
                  else if ((uVar13 != 0xc0) || (pNod_00->field_0x3 != '\x04')) goto LAB_008bd393;
LAB_008bd3e6:
                  local_38 = piVar7;
                  __ptr = Amap_LibDeriveGatePerm_rec(pLib,pNtk,uVar3 & 0xfffffffe,pNod_00);
                  if (__ptr != (Vec_Int_t *)0x0) {
                    pKVar5->field_0x1 = pKVar5->field_0x1 | 2;
                    if (0 < __ptr->nSize) {
                      lVar12 = 0;
                      do {
                        Vec_IntPush(pVVar8,__ptr->pArray[lVar12]);
                        lVar12 = lVar12 + 1;
                      } while (lVar12 < __ptr->nSize);
                    }
                    if (__ptr->pArray != (int *)0x0) {
                      free(__ptr->pArray);
                    }
                    free(__ptr);
                    piVar7 = local_38;
                    goto LAB_008bd3d3;
                  }
                  Vec_IntFree(pVVar6);
                  Vec_IntFree(p);
                  pVVar6 = pVVar8;
                  goto LAB_008bd4f5;
                }
                goto LAB_008bd517;
              }
            }
LAB_008bd3d3:
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar10);
        }
        if (uVar11 != p->nSize) {
          Vec_IntFreeP(&local_40);
        }
        if (pVVar6->pArray != (int *)0x0) {
          free(pVVar6->pArray);
        }
        free(pVVar6);
        if (p->pArray != (int *)0x0) {
          free(p->pArray);
        }
        free(p);
        return local_40;
      }
    }
    if (pVVar6->pArray != (int *)0x0) {
      free(pVVar6->pArray);
    }
    free(pVVar6);
    return (Vec_Int_t *)0x0;
  }
LAB_008bd536:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x12f,"int Abc_Lit2Var(int)");
LAB_008bd393:
  uVar9 = uVar9 - 1;
  if (uVar9 < 2) goto LAB_008bd3d3;
  goto LAB_008bd300;
}

Assistant:

Vec_Int_t * Amap_LibDeriveGatePerm_rec( Amap_Lib_t * pLib, Kit_DsdNtk_t * pNtk, int iLit, Amap_Nod_t * pNod )
{
    Vec_Int_t * vPerm, * vPermFanin, * vNodFanin, * vDsdLits;
    Kit_DsdObj_t * pDsdObj, * pDsdFanin;
    Amap_Nod_t * pNodFanin;
    int iDsdFanin, iNodFanin, Value, iDsdLit, i, k, j;
//    assert( !Abc_LitIsCompl(iLit) );
    pDsdObj = Kit_DsdNtkObj( pNtk, Abc_Lit2Var(iLit) );
    if ( pDsdObj == NULL )
    {
        vPerm = Vec_IntAlloc( 1 );
        Vec_IntPush( vPerm, iLit );
        return vPerm;
    }
    if ( pDsdObj->Type == KIT_DSD_PRIME && pNod->Type == AMAP_OBJ_MUX )
    {
        vPerm = Vec_IntAlloc( 10 );

        iDsdFanin  = pDsdObj->pFans[0];
        pNodFanin  = Amap_LibNod( pLib, Abc_Lit2Var(pNod->iFan0) );
        vPermFanin = Amap_LibDeriveGatePerm_rec( pLib, pNtk, iDsdFanin, pNodFanin );
        if ( vPermFanin == NULL )
        {
            Vec_IntFree( vPerm );
            return NULL;
        }
        Vec_IntForEachEntry( vPermFanin, Value, k )
            Vec_IntPush( vPerm, Value );
        Vec_IntFree( vPermFanin );

        iDsdFanin  = pDsdObj->pFans[1];
        pNodFanin  = Amap_LibNod( pLib, Abc_Lit2Var(pNod->iFan1) );
        vPermFanin = Amap_LibDeriveGatePerm_rec( pLib, pNtk, iDsdFanin, pNodFanin );
        if ( vPermFanin == NULL )
        {
            Vec_IntFree( vPerm );
            return NULL;
        }
        Vec_IntForEachEntry( vPermFanin, Value, k )
            Vec_IntPush( vPerm, Value );
        Vec_IntFree( vPermFanin );

        iDsdFanin  = pDsdObj->pFans[2];
        pNodFanin  = Amap_LibNod( pLib, Abc_Lit2Var(pNod->iFan2) );
        vPermFanin = Amap_LibDeriveGatePerm_rec( pLib, pNtk, iDsdFanin, pNodFanin );
        if ( vPermFanin == NULL )
        {
            Vec_IntFree( vPerm );
            return NULL;
        }
        Vec_IntForEachEntry( vPermFanin, Value, k )
            Vec_IntPush( vPerm, Value );
        Vec_IntFree( vPermFanin );

        return vPerm;
    }
    // return if wrong types
    if ( pDsdObj->Type == KIT_DSD_PRIME || pNod->Type == AMAP_OBJ_MUX )
        return NULL;
    // return if sizes do not agree
    vNodFanin = Amap_LibCollectFanins( pLib, pNod );
    if ( Vec_IntSize(vNodFanin) != (int)pDsdObj->nFans )
    {
        Vec_IntFree( vNodFanin );
        return NULL;
    }
    // match fanins of DSD with fanins of nodes
    // clean the mark and save variable literals
    vPerm = Vec_IntAlloc( 10 );
    vDsdLits = Vec_IntAlloc( 10 );
    Kit_DsdObjForEachFaninReverse( pNtk, pDsdObj, iDsdFanin, i )
    {
        pDsdFanin = Kit_DsdNtkObj( pNtk, Abc_Lit2Var(iDsdFanin) );
        if ( pDsdFanin )
            pDsdFanin->fMark = 0;
        else
            Vec_IntPush( vDsdLits, iDsdFanin );
    }
    // match each fanins of the node
    iDsdLit = 0;
    Vec_IntForEachEntry( vNodFanin, iNodFanin, k )
    {
        if ( iNodFanin == 0 )
        {
            if ( iDsdLit >= Vec_IntSize(vDsdLits) )
            {
                Vec_IntFree( vPerm );
                Vec_IntFree( vDsdLits );
                Vec_IntFree( vNodFanin );
                return NULL;
            }
            iDsdFanin = Vec_IntEntry( vDsdLits, iDsdLit++ );
            Vec_IntPush( vPerm, iDsdFanin );
            continue;
        }
        // find a matching component
        pNodFanin = Amap_LibNod( pLib, Abc_Lit2Var(iNodFanin) );
        Kit_DsdObjForEachFaninReverse( pNtk, pDsdObj, iDsdFanin, i )
        {
            pDsdFanin = Kit_DsdNtkObj( pNtk, Abc_Lit2Var(iDsdFanin) );
            if ( pDsdFanin == NULL )
                continue;
            if ( pDsdFanin->fMark == 1 )
                continue;
            if ( !((pDsdFanin->Type == KIT_DSD_AND && pNodFanin->Type == AMAP_OBJ_AND) ||
                   (pDsdFanin->Type == KIT_DSD_XOR && pNodFanin->Type == AMAP_OBJ_XOR) ||
                   (pDsdFanin->Type == KIT_DSD_PRIME && pNodFanin->Type == AMAP_OBJ_MUX)) )
                   continue;
            vPermFanin = Amap_LibDeriveGatePerm_rec( pLib, pNtk, Abc_LitRegular(iDsdFanin), pNodFanin );
            if ( vPermFanin == NULL )
            {
                Vec_IntFree( vNodFanin );
                Vec_IntFree( vDsdLits );
                Vec_IntFree( vPerm );
                return NULL;
            }
            pDsdFanin->fMark = 1;
            Vec_IntForEachEntry( vPermFanin, Value, j )
                Vec_IntPush( vPerm, Value );
            Vec_IntFree( vPermFanin );
            break;
        }
    }
//    assert( iDsdLit == Vec_IntSize(vDsdLits) );
    if ( iDsdLit != Vec_IntSize(vDsdLits) )
        Vec_IntFreeP( &vPerm );
    Vec_IntFree( vNodFanin );
    Vec_IntFree( vDsdLits );
    return vPerm;
}